

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateDataPhysBCFunct::operator()
          (StateDataPhysBCFunct *this,MultiFab *mf,int dest_comp,int num_comp,IntVect *param_4,
          Real time,int param_6)

{
  int *piVar1;
  StateData *pSVar2;
  Geometry *pGVar3;
  BaseFab<double> *src;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  StateDataPhysBCFunct *pSVar10;
  char cVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int dir_1;
  int iVar22;
  Box hi_slab;
  Box lo_slab;
  Box bx;
  Box db;
  Box GrownDomain;
  MFIter mfi;
  FArrayBox tmp;
  int aiStackY_2bc [55];
  undefined8 uStackY_1e0;
  Box local_1c8;
  Real local_1a8;
  int local_19c;
  Box local_198;
  int local_178 [6];
  uint uStack_160;
  Real *local_158;
  RealBox *local_150;
  StateDataPhysBCFunct *local_148;
  int local_13c;
  Box local_138;
  Box *local_110;
  undefined8 local_108;
  int iStack_100;
  int aiStack_fc [2];
  undefined8 uStack_f4;
  MultiFab *local_e0;
  MFIter local_d8;
  BaseFab<double> local_78;
  
  pSVar2 = this->statedata;
  uVar14 = 0;
  switch((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar14 = *(uint *)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op
    ;
    break;
  default:
    uVar14 = *(uint *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                              m_bat.m_op + 4);
  }
  uStack_160 = (pSVar2->domain).btype.itype;
  local_178[4] = (pSVar2->domain).bigend.vect[1];
  local_178[5] = (pSVar2->domain).bigend.vect[2];
  local_178[0] = (pSVar2->domain).smallend.vect[0];
  local_178[1] = (pSVar2->domain).smallend.vect[1];
  local_178[2] = (pSVar2->domain).smallend.vect[2];
  local_178[3] = (pSVar2->domain).bigend.vect[0];
  lVar13 = 0;
  do {
    uVar19 = 1 << ((byte)lVar13 & 0x1f);
    uVar12 = (uint)lVar13;
    local_178[lVar13 + 3] =
         (local_178[lVar13 + 3] + (uint)((uVar14 >> (uVar12 & 0x1f) & 1) != 0)) -
         (uint)((uStack_160 >> (uVar12 & 0x1f) & 1) != 0);
    if ((uVar14 >> (uVar12 & 0x1f) & 1) == 0) {
      uStack_160 = ~uVar19 & uStack_160;
    }
    else {
      uStack_160 = uVar19 | uStack_160;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  pGVar3 = this->geom;
  uStackY_1e0 = 0x4d0e30;
  local_1a8 = time;
  cVar11 = (**(code **)(*(long *)((pSVar2->desc->bc_func).
                                  super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t + 0x38))();
  uStackY_1e0 = 0x4d0e48;
  (**(code **)(*(long *)((this->statedata->desc->bc_func).
                         super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t + 0x30))();
  uStackY_1e0 = 0x4d0e55;
  FArrayBox::FArrayBox((FArrayBox *)&local_78);
  uStackY_1e0 = 0x4d0e67;
  MFIter::MFIter(&local_d8,(FabArrayBase *)mf,'\0');
  if (local_d8.currentIndex < local_d8.endIndex) {
    local_158 = (pGVar3->super_CoordSys).dx;
    local_150 = &pGVar3->prob_domain;
    local_19c = num_comp;
    local_148 = this;
    local_e0 = mf;
    do {
      iVar16 = local_d8.currentIndex;
      if (local_d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar16 = ((local_d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_d8.currentIndex];
      }
      src = &(mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar16]->super_BaseFab<double>;
      local_110 = &src->domain;
      lVar13 = 0x51;
      bVar9 = false;
      bVar8 = false;
      do {
        bVar17 = true;
        if (aiStackY_2bc[lVar13] <= *(int *)((long)src + lVar13 * 4 + -300)) {
          bVar17 = aiStackY_2bc[lVar13 + 3] <
                   *(int *)((long)(&src[-4].domain.smallend + -2) + lVar13 * 4);
        }
        bVar7 = (bool)(bVar8 | bVar17);
        if (*(char *)((long)(this->geom->super_CoordSys).offset + lVar13 + -8) == '\0') {
          bVar7 = bVar8;
          bVar9 = (bool)(bVar17 | bVar9);
        }
        lVar13 = lVar13 + 1;
        bVar8 = bVar7;
      } while (lVar13 != 0x54);
      if (bVar9) {
        if (cVar11 == '\0') {
          uStackY_1e0 = 0x4d0f96;
          StateData::FillBoundary
                    (this->statedata,(FArrayBox *)src,local_1a8,local_158,local_150,dest_comp,
                     this->src_comp,num_comp);
        }
        else {
          uStackY_1e0 = 0x4d0f6e;
          StateData::FillBoundary
                    (this->statedata,local_110,(FArrayBox *)src,local_1a8,this->geom,dest_comp,
                     this->src_comp,num_comp);
        }
        if (bVar7) {
          aiStack_fc[1] = local_178[4];
          uStack_f4 = CONCAT44(uStack_160,local_178[5]);
          local_108 = CONCAT44(local_178[1],local_178[0]);
          iStack_100 = local_178[2];
          aiStack_fc[0] = local_178[3];
          pGVar3 = this->geom;
          lVar13 = 0;
          do {
            if (*(char *)((long)(pGVar3->super_CoordSys).inv_dx + lVar13 + 0x19) == '\0') {
              iVar16 = (src->domain).smallend.vect[lVar13];
              iVar15 = local_178[lVar13] - iVar16;
              if (iVar15 != 0 && iVar16 <= local_178[lVar13]) {
                piVar1 = (int *)((long)&local_108 + lVar13 * 4);
                *piVar1 = *piVar1 - iVar15;
              }
              iVar16 = (src->domain).bigend.vect[lVar13] - local_178[lVar13 + 3];
              if (0 < iVar16) {
                aiStack_fc[lVar13] = aiStack_fc[lVar13] + iVar16;
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          local_13c = (int)local_108;
          lVar13 = 0;
          do {
            pSVar10 = local_148;
            iVar16 = local_19c;
            pGVar3 = this->geom;
            if (*(char *)((long)(pGVar3->super_CoordSys).inv_dx + lVar13 + 0x19) == '\x01') {
              uVar6 = *(undefined8 *)((local_110->smallend).vect + 2);
              local_198.bigend.vect[1] =
                   (int)((ulong)*(undefined8 *)(local_110->bigend).vect >> 0x20);
              local_198._20_8_ = *(undefined8 *)((local_110->bigend).vect + 2);
              local_198.smallend.vect._0_8_ = *(undefined8 *)(local_110->smallend).vect;
              local_198.smallend.vect[2] = (int)uVar6;
              local_198.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
              uVar6 = *(undefined8 *)((local_110->smallend).vect + 2);
              local_1c8.bigend.vect[1] =
                   (int)((ulong)*(undefined8 *)(local_110->bigend).vect >> 0x20);
              local_1c8._20_8_ = *(undefined8 *)((local_110->bigend).vect + 2);
              local_1c8.smallend.vect._0_8_ = *(undefined8 *)(local_110->smallend).vect;
              local_1c8.smallend.vect[2] = (int)uVar6;
              local_1c8.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
              iVar15 = ((pGVar3->domain).bigend.vect[lVar13] -
                       (pGVar3->domain).smallend.vect[lVar13]) + 1;
              piVar1 = local_198.smallend.vect + lVar13;
              *piVar1 = *piVar1 + iVar15;
              piVar1 = local_198.bigend.vect + lVar13;
              *piVar1 = *piVar1 + iVar15;
              piVar1 = local_1c8.smallend.vect + lVar13;
              *piVar1 = *piVar1 - iVar15;
              piVar1 = local_1c8.bigend.vect + lVar13;
              *piVar1 = *piVar1 - iVar15;
              iVar15 = local_198.smallend.vect[0];
              if (local_198.smallend.vect[0] <= local_13c) {
                iVar15 = local_13c;
              }
              if (local_198.smallend.vect[1] <= local_108._4_4_) {
                local_198.smallend.vect[1] = local_108._4_4_;
              }
              local_198.smallend.vect[0] = iVar15;
              if (local_198.smallend.vect[2] <= iStack_100) {
                local_198.smallend.vect[2] = iStack_100;
              }
              if (aiStack_fc[0] <= local_198.bigend.vect[0]) {
                local_198.bigend.vect[0] = aiStack_fc[0];
              }
              if (aiStack_fc[1] <= local_198.bigend.vect[1]) {
                local_198.bigend.vect[1] = aiStack_fc[1];
              }
              iVar4 = local_198.bigend.vect[2];
              if ((int)uStack_f4 <= local_198.bigend.vect[2]) {
                iVar4 = (int)uStack_f4;
              }
              iVar18 = local_1c8.smallend.vect[0];
              if (local_1c8.smallend.vect[0] <= local_13c) {
                iVar18 = local_13c;
              }
              iVar20 = local_108._4_4_;
              if (local_108._4_4_ < local_1c8.smallend.vect[1]) {
                iVar20 = local_1c8.smallend.vect[1];
              }
              local_1c8.smallend.vect[1] = iVar20;
              local_1c8.smallend.vect[0] = iVar18;
              iVar20 = iStack_100;
              if (iStack_100 < local_1c8.smallend.vect[2]) {
                iVar20 = local_1c8.smallend.vect[2];
              }
              iVar5 = aiStack_fc[0];
              if (local_1c8.bigend.vect[0] < aiStack_fc[0]) {
                iVar5 = local_1c8.bigend.vect[0];
              }
              iVar22 = aiStack_fc[1];
              if (local_1c8.bigend.vect[1] < aiStack_fc[1]) {
                iVar22 = local_1c8.bigend.vect[1];
              }
              iVar21 = (int)uStack_f4;
              if (local_1c8.bigend.vect[2] < (int)uStack_f4) {
                iVar21 = local_1c8.bigend.vect[2];
              }
              local_1c8.bigend.vect[2] = iVar21;
              local_198.bigend.vect[2] = iVar4;
              local_1c8.smallend.vect[2] = iVar20;
              local_1c8.bigend.vect[0] = iVar5;
              local_1c8.bigend.vect[1] = iVar22;
              if (iVar15 <= local_198.bigend.vect[0]) {
                if (((local_198.smallend.vect[1] <= local_198.bigend.vect[1]) &&
                    (local_198.smallend.vect[2] <= iVar4)) && (local_198.btype.itype < 8)) {
                  uStackY_1e0 = 0x4d119d;
                  FArrayBox::resize((FArrayBox *)&local_78,&local_198,local_19c,(Arena *)0x0);
                  iVar15 = ~(pSVar10->geom->domain).bigend.vect[lVar13] +
                           (pSVar10->geom->domain).smallend.vect[lVar13];
                  local_138.bigend.vect[1] = local_198.bigend.vect[1];
                  local_138.bigend.vect[2] = local_198.bigend.vect[2];
                  local_138.btype.itype = local_198.btype.itype;
                  local_138.smallend.vect[0] = local_198.smallend.vect[0];
                  local_138.smallend.vect[1] = local_198.smallend.vect[1];
                  local_138.smallend.vect[2] = local_198.smallend.vect[2];
                  local_138.bigend.vect[0] = local_198.bigend.vect[0];
                  piVar1 = local_138.smallend.vect + lVar13;
                  *piVar1 = *piVar1 + iVar15;
                  piVar1 = local_138.bigend.vect + lVar13;
                  *piVar1 = *piVar1 + iVar15;
                  uStackY_1e0 = 0x4d11fd;
                  BaseFab<double>::copy<(amrex::RunOn)1>
                            (&local_78,src,&local_138,dest_comp,&local_198,0,iVar16);
                  if (cVar11 == '\0') {
                    uStackY_1e0 = 0x4d1250;
                    StateData::FillBoundary
                              (pSVar10->statedata,(FArrayBox *)&local_78,local_1a8,local_158,
                               local_150,0,pSVar10->src_comp,iVar16);
                  }
                  else {
                    uStackY_1e0 = 0x4d1226;
                    StateData::FillBoundary
                              (pSVar10->statedata,&local_198,(FArrayBox *)&local_78,local_1a8,
                               pSVar10->geom,0,pSVar10->src_comp,iVar16);
                  }
                  uStackY_1e0 = 0x4d1270;
                  BaseFab<double>::copy<(amrex::RunOn)1>
                            (src,&local_78,&local_198,0,&local_138,dest_comp,iVar16);
                  iVar18 = local_1c8.smallend.vect[0];
                }
              }
              this = pSVar10;
              num_comp = iVar16;
              if (((iVar18 <= local_1c8.bigend.vect[0]) &&
                  (local_1c8.smallend.vect[1] <= local_1c8.bigend.vect[1])) &&
                 ((local_1c8.smallend.vect[2] <= local_1c8.bigend.vect[2] &&
                  (local_1c8.btype.itype < 8)))) {
                uStackY_1e0 = 0x4d12b8;
                FArrayBox::resize((FArrayBox *)&local_78,&local_1c8,iVar16,(Arena *)0x0);
                iVar15 = ((pSVar10->geom->domain).bigend.vect[lVar13] -
                         (pSVar10->geom->domain).smallend.vect[lVar13]) + 1;
                local_138.bigend.vect[1] = local_1c8.bigend.vect[1];
                local_138.bigend.vect[2] = local_1c8.bigend.vect[2];
                local_138.btype.itype = local_1c8.btype.itype;
                local_138.smallend.vect[0] = local_1c8.smallend.vect[0];
                local_138.smallend.vect[1] = local_1c8.smallend.vect[1];
                local_138.smallend.vect[2] = local_1c8.smallend.vect[2];
                local_138.bigend.vect[0] = local_1c8.bigend.vect[0];
                piVar1 = local_138.smallend.vect + lVar13;
                *piVar1 = *piVar1 + iVar15;
                piVar1 = local_138.bigend.vect + lVar13;
                *piVar1 = *piVar1 + iVar15;
                uStackY_1e0 = 0x4d131d;
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (&local_78,src,&local_138,dest_comp,&local_1c8,0,iVar16);
                if (cVar11 == '\0') {
                  uStackY_1e0 = 0x4d1396;
                  StateData::FillBoundary
                            (pSVar10->statedata,(FArrayBox *)&local_78,local_1a8,local_158,local_150
                             ,0,pSVar10->src_comp,iVar16);
                }
                else {
                  uStackY_1e0 = 0x4d1346;
                  StateData::FillBoundary
                            (pSVar10->statedata,&local_1c8,(FArrayBox *)&local_78,local_1a8,
                             pSVar10->geom,0,pSVar10->src_comp,iVar16);
                }
                uStackY_1e0 = 0x4d13b6;
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (src,&local_78,&local_1c8,0,&local_138,dest_comp,iVar16);
              }
            }
            lVar13 = lVar13 + 1;
            mf = local_e0;
          } while (lVar13 != 3);
        }
      }
      uStackY_1e0 = 0x4d13d8;
      MFIter::operator++(&local_d8);
    } while (local_d8.currentIndex < local_d8.endIndex);
  }
  uStackY_1e0 = 0x4d13f9;
  MFIter::~MFIter(&local_d8);
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  uStackY_1e0 = 0x4d1410;
  BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
StateDataPhysBCFunct::operator() (MultiFab& mf, int dest_comp, int num_comp, IntVect const& /* */,
                                  Real time, int /*bccomp*/)
{
    BL_PROFILE("StateDataPhysBCFunct::()");

    // Match domain box type to MF index type.
    const Box&     domain_mt   = amrex::convert(statedata->getDomain(),mf.ixType());
    const int*     domainlo    = domain_mt.loVect();
    const int*     domainhi    = domain_mt.hiVect();
    const Real*    dx          = geom.CellSize();
    const RealBox& prob_domain = geom.ProbDomain();

    bool has_bndryfunc_fab = statedata->desc->hasBndryFuncFab();
    bool run_on_gpu = statedata->desc->RunOnGPU() && Gpu::inLaunchRegion();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        FArrayBox tmp;

        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            FArrayBox& dest = mf[mfi];
            Array4<Real> const& desta = dest.array();
            const Box& bx = dest.box();

            bool has_phys_bc = false;
            bool is_periodic = false;
            for (int i = 0; i < AMREX_SPACEDIM; ++i) {
                bool touch = bx.smallEnd(i) < domainlo[i] || bx.bigEnd(i) > domainhi[i];
                if (geom.isPeriodic(i)) {
                    is_periodic = is_periodic || touch;
                } else {
                    has_phys_bc = has_phys_bc || touch;
                }
            }

            if (has_phys_bc)
            {
                if (has_bndryfunc_fab) {
                    statedata->FillBoundary(bx, dest, time, geom, dest_comp, src_comp, num_comp);
                } else {
                    statedata->FillBoundary(dest, time, dx, prob_domain, dest_comp, src_comp, num_comp);
                }

                if (is_periodic) // fix up corner
                {
                    Box GrownDomain = domain_mt;

                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                    {
                        if (!geom.isPeriodic(dir))
                        {
                            const int lo = domainlo[dir] - bx.smallEnd(dir);
                            const int hi = bx.bigEnd(dir) - domainhi[dir];
                            if (lo > 0) GrownDomain.growLo(dir,lo);
                            if (hi > 0) GrownDomain.growHi(dir,hi);
                        }
                    }

                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                    {
                        if (!geom.isPeriodic(dir)) continue;

                        Box lo_slab = bx;
                        Box hi_slab = bx;
                        lo_slab.shift(dir, geom.period(dir));
                        hi_slab.shift(dir,-geom.period(dir));
                        lo_slab &= GrownDomain;
                        hi_slab &= GrownDomain;

                        if (lo_slab.ok())
                        {
                            if (run_on_gpu)
                            {
                                tmp.resize(lo_slab,num_comp);
                                Elixir elitmp = tmp.elixir();
                                Array4<Real> const& tmpa = tmp.array();
                                const int ishift = -geom.period(dir);
                                amrex::launch(lo_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n)
                                                        = desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp);
                                                }
                                            }
                                        }
                                    }
                                });
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(lo_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                amrex::launch(lo_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp)
                                                        = tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n);
                                                }
                                            }
                                        }
                                    }
                                });
                            }
                            else
                            {
                                tmp.resize(lo_slab,num_comp);
                                const Box db = amrex::shift(lo_slab, dir, -geom.period(dir));
                                tmp.copy<RunOn::Host>(dest, db, dest_comp, lo_slab, 0, num_comp);
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(lo_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                dest.copy<RunOn::Host>(tmp, lo_slab, 0, db, dest_comp, num_comp);
                            }
                        }

                        if (hi_slab.ok())
                        {
                            if (run_on_gpu)
                            {
                                tmp.resize(hi_slab,num_comp);
                                Elixir elitmp = tmp.elixir();
                                Array4<Real> const& tmpa = tmp.array();
                                const int ishift = geom.period(dir);
                                amrex::launch(hi_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n)
                                                        = desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp);
                                                }
                                            }
                                        }
                                    }
                                });
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(hi_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                amrex::launch(hi_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp)
                                                        = tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n);
                                                }
                                            }
                                        }
                                    }
                                });
                            }
                            else
                            {
                                tmp.resize(hi_slab,num_comp);
                                const Box db = amrex::shift(hi_slab, dir, geom.period(dir));
                                tmp.copy<RunOn::Host>(dest, db, dest_comp, hi_slab, 0, num_comp);
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(hi_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                dest.copy<RunOn::Host>(tmp, hi_slab, 0, db, dest_comp, num_comp);
                            }
                        }
                    }
                }
            }
        }
    }
}